

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool testing::internal::DeathTest::Create
               (char *statement,
               Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *matcher,char *file,int line,DeathTest **test)

{
  DeathTestFactory *pDVar1;
  int iVar2;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  UnitTest::GetInstance();
  pDVar1 = ((UnitTest::GetInstance::instance.impl_)->death_test_factory_)._M_t.
           super___uniq_ptr_impl<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::DeathTestFactory_*,_std::default_delete<testing::internal::DeathTestFactory>_>
           .super__Head_base<0UL,_testing::internal::DeathTestFactory_*,_false>._M_head_impl;
  local_40.vtable_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).vtable_;
  local_40.buffer_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).buffer_;
  (matcher->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0016d8b8;
  iVar2 = (*pDVar1->_vptr_DeathTestFactory[2])
                    (pDVar1,statement,&local_40,file,(ulong)(uint)line,test);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_40);
  return SUB41(iVar2,0);
}

Assistant:

bool DeathTest::Create(const char* statement,
                       Matcher<const std::string&> matcher, const char* file,
                       int line, DeathTest** test) {
  return GetUnitTestImpl()->death_test_factory()->Create(
      statement, std::move(matcher), file, line, test);
}